

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::OptionSectionParser::parseLine
          (OptionSectionParser *this,ForceField *param_1,string *line,int lineNo)

{
  int iVar1;
  string optionName;
  string optionValue;
  StringTokenizer tokenizer;
  string local_b0;
  string local_90;
  StringTokenizer local_70;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0," ;\t\n\r",(allocator<char> *)&local_90);
  StringTokenizer::StringTokenizer(&local_70,line,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  iVar1 = StringTokenizer::countTokens(&local_70);
  if (iVar1 < 2) {
    snprintf(painCave.errMsg,2000,"OptionSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_b0,&local_70);
    StringTokenizer::nextToken_abi_cxx11_(&local_90,&local_70);
    ForceFieldOptions::setData(this->options_,&local_b0,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  StringTokenizer::~StringTokenizer(&local_70);
  return;
}

Assistant:

void OptionSectionParser::parseLine(ForceField&, const std::string& line,
                                      int lineNo) {
    StringTokenizer tokenizer(line);

    if (tokenizer.countTokens() >= 2) {
      std::string optionName  = tokenizer.nextToken();
      std::string optionValue = tokenizer.nextToken();

      options_.setData(optionName, optionValue);

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "OptionSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }
  }